

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O1

void * __thiscall
embree::InstanceArray::getBufferData
          (InstanceArray *this,RTCBufferType type,uint slot,BufferDataPointerType pointerType)

{
  RawBufferView *pRVar1;
  undefined8 *puVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (type == RTC_BUFFER_TYPE_INDEX) {
    if (slot != 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"invalid index buffer slot. must be 0","");
      *puVar2 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar2 + 1) = 2;
      puVar2[2] = puVar2 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if (pointerType == HOST) {
      pRVar1 = &(this->object_ids).super_RawBufferView;
    }
    else {
      if (pointerType != DEVICE) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"invalid buffer data pointer type specified","");
        *puVar2 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar2 + 1) = 2;
        puVar2[2] = puVar2 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 2),local_40,local_40 + local_38);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      pRVar1 = (RawBufferView *)&(this->object_ids).super_RawBufferView.dptr_ofs;
    }
  }
  else {
    if (type != RTC_BUFFER_TYPE_TRANSFORM) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unknown buffer type","");
      *puVar2 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar2 + 1) = 2;
      puVar2[2] = puVar2 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if ((this->l2w_buf).size_active <= (ulong)slot) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"invalid transform buffer slot","");
      *puVar2 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar2 + 1) = 2;
      puVar2[2] = puVar2 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar1 = (this->l2w_buf).items + slot;
    if (pointerType != HOST) {
      if (pointerType != DEVICE) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"invalid buffer data pointer type specified","");
        *puVar2 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar2 + 1) = 2;
        puVar2[2] = puVar2 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 2),local_40,local_40 + local_38);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      pRVar1 = (RawBufferView *)&pRVar1->dptr_ofs;
    }
  }
  return pRVar1->ptr_ofs;
}

Assistant:

void* InstanceArray::getBufferData(RTCBufferType type, unsigned int slot, BufferDataPointerType pointerType)
  {
    if (type == RTC_BUFFER_TYPE_TRANSFORM)
    {
      if (slot >= l2w_buf.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid transform buffer slot");
      return l2w_buf[slot].getPtr(pointerType);
    }
    else if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid index buffer slot. must be 0");
      return object_ids.getPtr(pointerType);
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
      return nullptr;
    }
  }